

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O1

void Gia_WriteDotAigSimple(Gia_Man_t *p,char *pFileName,Vec_Int_t *vBold)

{
  undefined1 *puVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  ulong uVar13;
  size_t __size;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  
  if ((p->vCis->nSize - p->nObjs) + p->vCos->nSize < -0x7d1) {
    fprintf(_stdout,"Cannot visualize AIG with more than %d nodes.\n",2000);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    return;
  }
  if (vBold == (Vec_Int_t *)0x0) {
    if (((p->nXors != 0) || (p->nMuxes != 0)) && (uVar13 = (ulong)(uint)p->nObjs, 0 < p->nObjs)) {
      lVar7 = 0;
      lVar11 = 0;
      do {
        pGVar9 = p->pObjs;
        if (pGVar9 == (Gia_Obj_t *)0x0) break;
        uVar8 = *(ulong *)(&pGVar9->field_0x0 + lVar7);
        uVar6 = (uint)uVar8;
        if (((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) ||
           (((uint)(uVar8 >> 0x20) & 0x1fffffff) <= (uVar6 & 0x1fffffff))) {
          if ((int)uVar13 <= lVar11) goto LAB_007c0e0b;
          if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar11] != 0)) goto LAB_007bfdcc;
        }
        else {
LAB_007bfdcc:
          *(ulong *)(&pGVar9->field_0x0 + lVar7) = uVar8 | 0x40000000;
        }
        lVar11 = lVar11 + 1;
        uVar13 = (ulong)p->nObjs;
        lVar7 = lVar7 + 0xc;
      } while (lVar11 < (long)uVar13);
    }
  }
  else if (0 < vBold->nSize) {
    lVar7 = 0;
    do {
      iVar17 = vBold->pArray[lVar7];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_007c0e49;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar17].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vBold->nSize);
  }
  uVar6 = Gia_ManLevelNum(p);
  uVar13 = (ulong)uVar6;
  uVar15 = uVar6 + 1;
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    piVar2 = pVVar10->pArray;
    lVar7 = 0;
    do {
      iVar17 = piVar2[lVar7];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_007c0e49;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p->vLevels->nSize <= iVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vLevels->pArray[iVar17] = uVar15;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar10->nSize);
  }
  fprintf(__stream,"# %s\n","AIG structure generated by GIA package");
  fputc(10,__stream);
  fwrite("digraph AIG {\n",0xe,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  if (-2 < (int)uVar6) {
    uVar16 = uVar6 + 2;
    do {
      uVar16 = uVar16 - 1;
      fprintf(__stream,"  Level%d",(ulong)uVar16);
      fwrite(" [label = ",10,1,__stream);
      fputc(0x22,__stream);
      fputc(0x22,__stream);
      fwrite("];\n",3,1,__stream);
    } while (0 < (int)uVar16);
  }
  fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  uVar16 = uVar15;
  if (-2 < (int)uVar6) {
    do {
      fprintf(__stream,"  Level%d",(ulong)uVar16);
      if (uVar16 == 0) {
        fputc(0x3b,__stream);
      }
      else {
        fwrite(" ->",3,1,__stream);
      }
      bVar5 = 0 < (int)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar5);
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("AIG structure visualized by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fprintf(__stream,"The AIG contains %d nodes and spans %d levels.",
          (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),uVar13);
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",(ulong)uVar15);
  pVVar10 = p->vCos;
  if (pVVar10->nSize < 1) {
    bVar5 = true;
  }
  else {
    lVar7 = 0;
    bVar5 = false;
    do {
      uVar15 = pVVar10->pArray[lVar7];
      if (((long)(int)uVar15 < 0) || (p->nObjs <= (int)uVar15)) goto LAB_007c0e49;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (uVar15 == (*(uint *)(p->pObjs + (int)uVar15) & 0x1fffffff)) {
        bVar5 = true;
      }
      fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar15);
      fprintf(__stream,", shape = %s","invtriangle");
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
      lVar7 = lVar7 + 1;
      pVVar10 = p->vCos;
    } while (lVar7 < pVVar10->nSize);
    bVar5 = !bVar5;
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  if (0 < (int)uVar6) {
    do {
      fwrite("{\n",2,1,__stream);
      fwrite("  rank = same;\n",0xf,1,__stream);
      fprintf(__stream,"  Level%d;\n",uVar13);
      uVar8 = (ulong)(uint)p->nObjs;
      iVar17 = (int)uVar13;
      if (0 < p->nObjs) {
        lVar7 = 0;
        uVar13 = 0;
        uVar12 = extraout_RDX;
        do {
          pGVar9 = p->pObjs;
          if (pGVar9 == (Gia_Obj_t *)0x0) break;
          if ((long)(int)uVar8 <= (long)uVar13) goto LAB_007c0e0b;
          pVVar10 = p->vLevels;
          Vec_IntFillExtra(pVVar10,(int)uVar13 + 1,(int)uVar12);
          if ((long)pVVar10->nSize <= (long)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar12 = extraout_RDX_00;
          if (pVVar10->pArray[uVar13] == iVar17) {
            pGVar3 = (Gia_Obj_t *)(&pGVar9->field_0x0 + lVar7);
            fprintf(__stream,"  Node%d [label = \"%d\"",uVar13 & 0xffffffff,uVar13 & 0xffffffff);
            uVar6 = (uint)*(undefined8 *)pGVar3;
            if (((~uVar6 & 0x1fffffff) == 0 || (int)uVar6 < 0) ||
               (((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff) <= (uVar6 & 0x1fffffff))
               ) {
              pGVar4 = p->pObjs;
              if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_007c0e0b;
              if ((p->pMuxes == (uint *)0x0) ||
                 (p->pMuxes[(int)((ulong)((long)pGVar9 + (lVar7 - (long)pGVar4)) >> 2) * -0x55555555
                           ] == 0)) {
                __size = 0x11;
                pcVar14 = ", shape = ellipse";
              }
              else {
                __size = 0x13;
                pcVar14 = ", shape = trapezium";
              }
            }
            else {
              __size = 0x16;
              pcVar14 = ", shape = doublecircle";
            }
            fwrite(pcVar14,__size,1,__stream);
            if ((pGVar3->field_0x3 & 0x40) != 0) {
              fwrite(", style = filled",0x10,1,__stream);
            }
            fwrite("];\n",3,1,__stream);
            uVar12 = extraout_RDX_01;
          }
          uVar8 = (ulong)p->nObjs;
          lVar7 = lVar7 + 0xc;
          uVar13 = uVar13 + 1;
        } while ((long)uVar13 < (long)uVar8);
      }
      fputc(0x7d,__stream);
      fputc(10,__stream);
      fputc(10,__stream);
      uVar13 = (ulong)(iVar17 - 1);
    } while (1 < iVar17);
  }
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fprintf(__stream,"  Level%d;\n",0);
  if (!bVar5) {
    fprintf(__stream,"  Node%d [label = \"Const0\"",0);
    fwrite(", shape = ellipse",0x11,1,__stream);
    fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
    fwrite("];\n",3,1,__stream);
  }
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar7 = 0;
    do {
      uVar6 = pVVar10->pArray[lVar7];
      if (((int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007c0e49;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)uVar6);
      fprintf(__stream,", shape = %s","triangle");
      fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
      fwrite("];\n",3,1,__stream);
      lVar7 = lVar7 + 1;
      pVVar10 = p->vCis;
    } while (lVar7 < pVVar10->nSize);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar7 = 0;
    do {
      if ((pVVar10->pArray[lVar7] < 0) || (p->nObjs <= pVVar10->pArray[lVar7])) goto LAB_007c0e49;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      fprintf(__stream,"title2 -> Node%d [style = invis];\n");
      lVar7 = lVar7 + 1;
      pVVar10 = p->vCos;
    } while (lVar7 < pVVar10->nSize);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    uVar13 = 0xffffffff;
    lVar7 = 0;
    do {
      uVar6 = pVVar10->pArray[lVar7];
      if (((long)(int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007c0e49;
      pGVar9 = p->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      if (lVar7 != 0) {
        if (p->nObjs <= (int)uVar6) goto LAB_007c0e0b;
        fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar13,(ulong)uVar6);
      }
      pGVar9 = pGVar9 + (int)uVar6;
      pGVar3 = p->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p->nObjs <= pGVar9)) goto LAB_007c0e0b;
      uVar13 = (ulong)(uint)((int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      lVar7 = lVar7 + 1;
      pVVar10 = p->vCos;
    } while (lVar7 < pVVar10->nSize);
  }
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    uVar13 = 0xffffffff;
    lVar7 = 0;
    do {
      uVar6 = pVVar10->pArray[lVar7];
      if (((long)(int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) goto LAB_007c0e49;
      pGVar9 = p->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      if (lVar7 != 0) {
        if (p->nObjs <= (int)uVar6) goto LAB_007c0e0b;
        fprintf(__stream,"Node%d -> Node%d [style = invis];\n",uVar13,(ulong)uVar6);
      }
      pGVar9 = pGVar9 + (int)uVar6;
      pGVar3 = p->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p->nObjs <= pGVar9)) goto LAB_007c0e0b;
      uVar13 = (ulong)(uint)((int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      lVar7 = lVar7 + 1;
      pVVar10 = p->vCis;
    } while (lVar7 < pVVar10->nSize);
  }
  if (0 < p->nObjs) {
    lVar7 = 0;
    uVar13 = 0;
    do {
      pGVar9 = p->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      pGVar3 = (Gia_Obj_t *)(&pGVar9->field_0x0 + lVar7);
      if ((~*(uint *)pGVar3 & 0x1fffffff) != 0) {
        fprintf(__stream,"Node%d",uVar13 & 0xffffffff);
        fwrite(" -> ",4,1,__stream);
        fprintf(__stream,"Node%d",(ulong)((int)uVar13 - (*(uint *)pGVar3 & 0x1fffffff)));
        fwrite(" [",2,1,__stream);
        pcVar14 = "dotted";
        if ((*(uint *)pGVar3 >> 0x1d & 1) == 0) {
          pcVar14 = "solid";
        }
        fprintf(__stream,"style = %s",pcVar14);
        fputc(0x5d,__stream);
        fwrite(";\n",2,1,__stream);
        if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
          fprintf(__stream,"Node%d",uVar13 & 0xffffffff);
          fwrite(" -> ",4,1,__stream);
          fprintf(__stream,"Node%d",
                  (ulong)((int)uVar13 - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff)));
          fwrite(" [",2,1,__stream);
          pcVar14 = "dotted";
          if ((*(ulong *)pGVar3 >> 0x3d & 1) == 0) {
            pcVar14 = "solid";
          }
          fprintf(__stream,"style = %s",pcVar14);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_007c0e0b;
          if ((p->pMuxes != (uint *)0x0) &&
             (p->pMuxes[(int)((ulong)((long)pGVar9 + (lVar7 - (long)pGVar4)) >> 2) * -0x55555555] !=
              0)) {
            fprintf(__stream,"Node%d",uVar13 & 0xffffffff);
            fwrite(" -> ",4,1,__stream);
            uVar8 = 0xffffffff;
            if (p->pMuxes != (uint *)0x0) {
              uVar6 = p->pMuxes[uVar13];
              if (uVar6 != 0) {
                if ((int)uVar6 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar8 = (ulong)(uVar6 >> 1);
              }
            }
            fprintf(__stream,"Node%d",uVar8);
            fwrite(" [",2,1,__stream);
            pcVar14 = "bold";
            if (p->pMuxes != (uint *)0x0) {
              pGVar4 = p->pObjs;
              if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) {
LAB_007c0e0b:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              uVar6 = p->pMuxes[(int)((ulong)((long)pGVar9 + (lVar7 - (long)pGVar4)) >> 2) *
                                -0x55555555];
              if ((int)uVar6 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              pcVar14 = "dotted";
              if ((uVar6 & 1) == 0) {
                pcVar14 = "bold";
              }
            }
            fprintf(__stream,"style = %s",pcVar14);
            fputc(0x5d,__stream);
            fwrite(";\n",2,1,__stream);
          }
        }
      }
      uVar13 = uVar13 + 1;
      lVar7 = lVar7 + 0xc;
    } while ((long)uVar13 < (long)p->nObjs);
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (vBold == (Vec_Int_t *)0x0) {
    if ((p->nXors != 0) || (p->nMuxes != 0)) {
      Gia_ManCleanMark0(p);
    }
  }
  else if (0 < vBold->nSize) {
    lVar7 = 0;
    do {
      iVar17 = vBold->pArray[lVar7];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) {
LAB_007c0e49:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar17].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vBold->nSize);
  }
  if (p->vLevels != (Vec_Int_t *)0x0) {
    piVar2 = p->vLevels->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vLevels->pArray = (int *)0x0;
    }
    if (p->vLevels != (Vec_Int_t *)0x0) {
      free(p->vLevels);
      p->vLevels = (Vec_Int_t *)0x0;
    }
  }
  return;
}

Assistant:

void Gia_WriteDotAigSimple( Gia_Man_t * p, char * pFileName, Vec_Int_t * vBold )
{
    FILE * pFile;
    Gia_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;
    int fConstIsUsed = 0;

    if ( Gia_ManAndNum(p) > NODE_MAX )
    {
        fprintf( stdout, "Cannot visualize AIG with more than %d nodes.\n", NODE_MAX );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 1;
    else if ( p->nXors || p->nMuxes )
        Gia_ManForEachObj( p, pNode, i )
            if ( Gia_ObjIsXor(pNode) || Gia_ObjIsMux(p, pNode) )
                pNode->fMark0 = 1;

    // compute levels
    LevelMax = 1 + Gia_ManLevelNum( p );
    Gia_ManForEachCo( p, pNode, i )
        Vec_IntWriteEntry( p->vLevels, Gia_ObjId(p, pNode), LevelMax );

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by GIA package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The AIG contains %d nodes and spans %d levels.", Gia_ManAndNum(p), LevelMax-1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( Gia_ObjFaninId0p(p, pNode) == 0 )
            fConstIsUsed = 1;
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_in":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_in":""), 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Gia_ManForEachObj( p, pNode, i )
        {
            if ( (int)Gia_ObjLevel(p, pNode) != Level )
                continue;
/*
            if ( fHaig || pNode->pEquiv == NULL )
                fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            else 
                fprintf( pFile, "  Node%d [label = \"%d(%d%s)\"", pNode->Id, pNode->Id, 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
            fprintf( pFile, "  Node%d [label = \"%d\"", i, i ); 

            if ( Gia_ObjIsXor(pNode) )
                fprintf( pFile, ", shape = doublecircle" );
            else if ( Gia_ObjIsMux(p, pNode) )
                fprintf( pFile, ", shape = trapezium" );
            else
                fprintf( pFile, ", shape = ellipse" );

            if ( pNode->fMark0 )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( fConstIsUsed )
    {
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const0\"", 0 );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Gia_ManForEachCi( p, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_out":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Gia_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Gia_ObjIsLatch(pNode)? "_out":""), 
                    Gia_Regular(pNode->pEquiv)->Id, Gia_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", Gia_ObjId(p, pNode), Gia_ObjId(p, pNode) ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Gia_ManForEachCo( p, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", Gia_ObjId(p, pNode) );
    // generate invisible edges among the COs
    Prev = -1;
    Gia_ManForEachCo( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }
    // generate invisible edges among the CIs
    Prev = -1;
    Gia_ManForEachCi( p, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, Gia_ObjId(p, pNode) );
        Prev = Gia_ObjId(p, pNode);
    }

    // generate edges
    Gia_ManForEachObj( p, pNode, i )
    {
        if ( !Gia_ObjIsAnd(pNode) && !Gia_ObjIsCo(pNode) && !Gia_ObjIsBuf(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId0(pNode, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC0(pNode)? "dotted" : "solid" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL0(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,0) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Gia_ObjIsAnd(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId1(pNode, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC1(pNode)? "dotted" : "solid" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

        if ( !Gia_ObjIsMux(p, pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  i );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Gia_ObjFaninId2(p, i) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Gia_ObjFaninC2(p, pNode)? "dotted" : "bold" );
//        if ( Gia_NtkIsSeq(pNode->p) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );

/*
        // generate the edges between the equivalent nodes
        if ( fHaig && pNode->pEquiv && Gia_ObjRefs(pNode) > 0 )
        {
            pPrev = pNode;
            for ( pTemp = pNode->pEquiv; pTemp != pNode; pTemp = Gia_Regular(pTemp->pEquiv) )
            {
                fprintf( pFile, "Node%d",  pPrev->Id );
                fprintf( pFile, " -> " );
                fprintf( pFile, "Node%d",  pTemp->Id );
                fprintf( pFile, " [style = %s]", Gia_IsComplement(pTemp->pEquiv)? "dotted" : "solid" );
                fprintf( pFile, ";\n" );
                pPrev = pTemp;
            }
            // connect the last node with the first
            fprintf( pFile, "Node%d",  pPrev->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " [style = %s]", Gia_IsComplement(pPrev->pEquiv)? "dotted" : "solid" );
            fprintf( pFile, ";\n" );
        }
*/
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Gia_ManForEachObjVec( vBold, p, pNode, i )
            pNode->fMark0 = 0;
    else if ( p->nXors || p->nMuxes )
        Gia_ManCleanMark0( p );

    Vec_IntFreeP( &p->vLevels );
}